

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

int __thiscall GameLoop::loop(GameLoop *this,int maxTurn)

{
  Player *this_00;
  bool bVar1;
  reference ppPVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (maxTurn == -1) {
    iVar4 = -1;
  }
  else {
    iVar4 = (int)((ulong)((long)(this->allPlayers->
                                super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->allPlayers->
                               super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 3) * maxTurn;
  }
  iVar6 = 1;
  iVar5 = 0;
  do {
    ppPVar2 = std::vector<Player_*,_std::allocator<Player_*>_>::at(this->allPlayers,(long)iVar5);
    this_00 = *ppPVar2;
    if ((this_00->pOwnedCountries->
        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (this_00->pOwnedCountries->
        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar5 = iVar5 + 1;
      if ((long)(this->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 == (long)iVar5) {
        iVar5 = 0;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "\x1b[0m\n--------------------------------------------------------\n----------------------TURN "
                              );
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
      poVar3 = std::operator<<(poVar3,"----------------------------\n");
      poVar3 = std::operator<<(poVar3,"--------------------------------------------------------");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::operator<<((ostream *)&std::cout,"\x1b[35m");
      Player::reinforce(this_00);
      std::operator<<((ostream *)&std::cout,"\x1b[33m");
      Player::attack(this_00);
      bVar1 = isGameDone(this_00,this->gameMap);
      if (bVar1) {
        Player::notifyAll(this_00);
        std::ostream::flush();
        return *this_00->pPlayerId;
      }
      iVar4 = iVar4 + -1;
      iVar5 = iVar5 + 1;
      if ((long)(this->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 == (long)iVar5) {
        iVar5 = 0;
      }
      std::operator<<((ostream *)&std::cout,"\x1b[34m");
      Player::fortify(this_00);
      iVar6 = iVar6 + 1;
    }
  } while ((maxTurn == -1) || (0 < iVar4));
  std::operator<<((ostream *)&std::cout,"\x1b[1m\x1b[33m");
  poVar3 = std::operator<<((ostream *)&std::cout,"There are no more turns left. It is a draw!!");
  std::endl<char,std::char_traits<char>>(poVar3);
  return -1;
}

Assistant:

int GameLoop::loop(int maxTurn) {
    bool gameNotDone;
    int currentPlayerPosition = 0;
    Player* currentPlayer = nullptr;
    int turnCounter = 1;

    //limit or not number of turns
    int turnsLeft = -1;
    bool limitTurns = false;
    if (maxTurn != -1) {
        turnsLeft = maxTurn * int(allPlayers->size());
        limitTurns = true;
    }

    do {
        currentPlayer = allPlayers->at(currentPlayerPosition);
        if (!currentPlayer->getOwnedCountries()->empty()) {
            std::cout << "\u001b[0m\n--------------------------------------------------------\n"
                         "----------------------TURN " << turnCounter << "----------------------------\n"
                      << "--------------------------------------------------------" << std::endl;
            turnsLeft--;

            cout << "\u001b[35m";
            currentPlayer->reinforce();

            cout << "\u001b[33m";
            currentPlayer->attack();

            gameNotDone = !isGameDone(currentPlayer, gameMap);

            if (gameNotDone) {
                currentPlayerPosition++;
                if (isRoundFinished(currentPlayerPosition)) {
                    currentPlayerPosition = 0;
                }
            } else {
                currentPlayer->notifyAll();
                cout.flush();
                return currentPlayer->getPlayerId();
            }

            cout << "\u001b[34m";
            currentPlayer->fortify();

            turnCounter++;
        } else {
            currentPlayerPosition++;
            if (isRoundFinished(currentPlayerPosition)) {
                currentPlayerPosition = 0;
            }
        }

        if (limitTurns && turnsLeft <= 0) {
            std::cout << "\033[1m\033[33m";
            std::cout << "There are no more turns left. It is a draw!!" << std::endl;
            return -1;
        }
    } while (true);
}